

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressionAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::Compression>::readValueFrom
          (TypedAttribute<Imf_2_5::Compression> *this,IStream *is,int size,int version)

{
  uchar *in_RDI;
  uchar tmp;
  undefined7 in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe7;
  
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            ((IStream *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),in_RDI);
  if ((((((in_stack_ffffffffffffffe7 != 0) && (in_stack_ffffffffffffffe7 != 1)) &&
        (in_stack_ffffffffffffffe7 != 2)) &&
       ((in_stack_ffffffffffffffe7 != 3 && (in_stack_ffffffffffffffe7 != 4)))) &&
      ((in_stack_ffffffffffffffe7 != 5 &&
       ((in_stack_ffffffffffffffe7 != 6 && (in_stack_ffffffffffffffe7 != 7)))))) &&
     ((in_stack_ffffffffffffffe7 != 8 && (in_stack_ffffffffffffffe7 != 9)))) {
    in_stack_ffffffffffffffe7 = 10;
  }
  *(uint *)(in_RDI + 8) = (uint)in_stack_ffffffffffffffe7;
  return;
}

Assistant:

void
CompressionAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    unsigned char tmp;
    Xdr::read <StreamIO> (is, tmp);

    //
    // prevent invalid values being written to Compressin enum
    // by forcing all unknown types to NUM_COMPRESSION_METHODS which is also an invalid
    // pixel type, but can be used as a PixelType enum value
    // (Header::sanityCheck will throw an exception when files with invalid Compression types are read)
    //

    if (tmp!= NO_COMPRESSION &&
      tmp != RLE_COMPRESSION &&
      tmp != ZIPS_COMPRESSION &&
      tmp != ZIP_COMPRESSION &&
      tmp != PIZ_COMPRESSION &&
      tmp != PXR24_COMPRESSION &&
      tmp != B44_COMPRESSION &&
      tmp != B44A_COMPRESSION &&
      tmp != DWAA_COMPRESSION &&
      tmp != DWAB_COMPRESSION)
    {
        tmp = NUM_COMPRESSION_METHODS;
    }

    _value = Compression (tmp);
}